

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O3

int __thiscall gmlc::utilities::string_viewOps::toIntSimple(string_viewOps *this,string_view input)

{
  int iVar1;
  string_viewOps *psVar2;
  int iVar3;
  const_iterator __begin2;
  
  if (this != (string_viewOps *)0x0) {
    psVar2 = (string_viewOps *)0x0;
    iVar3 = 0;
    do {
      iVar1 = ((byte)psVar2[input._M_len] - 0x30) + iVar3 * 10;
      if (9 < (byte)((char)psVar2[input._M_len] - 0x30U)) {
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      psVar2 = psVar2 + 1;
    } while (this != psVar2);
    return iVar3;
  }
  return 0;
}

Assistant:

int toIntSimple(std::string_view input)
{
    int ret = 0;
    for (auto testChar : input) {
        if (testChar >= '0' && testChar <= '9') {
            ret = 10 * ret + (testChar - '0');
        }
    }
    return ret;
}